

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureFilterCase::test
          (TextureFilterCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  TestLog *pTVar1;
  pointer puVar2;
  bool bVar3;
  char cVar4;
  GLenum GVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  int iVar9;
  ulong uVar10;
  undefined8 uVar11;
  int expected;
  long lVar12;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  GLint value;
  ScopedLogSection section_1;
  string local_110;
  ScopedLogSection local_f0;
  long local_e8;
  TestLog local_e0;
  long lStack_d8;
  char local_c9;
  string local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  string local_90;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  uint local_4c;
  code *local_48;
  GLenum local_40;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  bVar3 = isPureIntTester(tester);
  cVar4 = true;
  if (!bVar3) {
    cVar4 = isPureUintTester(tester);
  }
  GVar5 = (this->super_TextureTest).m_pname;
  iVar9 = 0x2702;
  if (GVar5 != 0x2801) {
    iVar9 = 0;
  }
  expected = 0x2601;
  if (GVar5 != 0x2800) {
    expected = iVar9;
  }
  if ((bool)cVar4 == false) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_c9 = cVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Initial","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_f0,pTVar1,&local_110,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    cVar4 = local_c9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               expected,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_f0.m_log);
  }
  pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Set","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar1,&local_110,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_110._M_dataplus._M_p._0_4_ = 0x2600;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_a8,(iterator)0x0,(uint *)&local_110);
  local_110._M_dataplus._M_p._0_4_ = 0x2601;
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_a8,
               (iterator)
               local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_110);
  }
  else {
    *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x2601;
    local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  if ((this->super_TextureTest).m_pname == 0x2801) {
    local_110._M_dataplus._M_p._0_4_ = 0x2700;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_110);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2700;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_110._M_dataplus._M_p._0_4_ = 0x2702;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_110);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2702;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_110._M_dataplus._M_p._0_4_ = 0x2701;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_110);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2701;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_110._M_dataplus._M_p._0_4_ = 0x2703;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_110);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x2703;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar9 = (int)((ulong)((long)local_a8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2);
  if (cVar4 == '\0') {
    if (0 < iVar9) {
      lVar12 = 0;
      do {
        glu::CallLogWrapper::glTexParameteri
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12]);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_48);
          uVar10 = 0xf;
          if (local_70 != local_60) {
            uVar10 = local_60[0];
          }
          if (uVar10 < local_90._M_string_length + local_68) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              uVar11 = local_90.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_90._M_string_length + local_68) goto LAB_00938479;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00938479:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
          }
          local_f0.m_log = &local_e0;
          pTVar1 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar1) {
            local_e0.m_log = pTVar1->m_log;
            lStack_d8 = plVar6[3];
          }
          else {
            local_e0.m_log = pTVar1->m_log;
            local_f0.m_log = (TestLog *)*plVar6;
          }
          local_e8 = plVar6[1];
          *plVar6 = (long)pTVar1;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar1->m_log = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = puVar7[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_c8._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_110.field_2._M_allocated_capacity = *psVar8;
            local_110.field_2._8_8_ = plVar6[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar8;
            local_110._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_110._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_f0.m_log != &local_e0) {
            operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12],(this->super_TextureTest).m_type);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)((ulong)((long)local_a8.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_a8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    if (0 < (int)((ulong)((long)local_a8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_a8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      lVar12 = 0;
      do {
        glu::CallLogWrapper::glTexParameterf
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (float)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12]);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_48);
          uVar10 = 0xf;
          if (local_70 != local_60) {
            uVar10 = local_60[0];
          }
          if (uVar10 < local_90._M_string_length + local_68) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              uVar11 = local_90.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_90._M_string_length + local_68) goto LAB_00938773;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00938773:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
          }
          local_f0.m_log = &local_e0;
          pTVar1 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar1) {
            local_e0.m_log = pTVar1->m_log;
            lStack_d8 = plVar6[3];
          }
          else {
            local_e0.m_log = pTVar1->m_log;
            local_f0.m_log = (TestLog *)*plVar6;
          }
          local_e8 = plVar6[1];
          *plVar6 = (long)pTVar1;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar1->m_log = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar8 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = puVar7[3];
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_c8._M_string_length = puVar7[1];
          *puVar7 = psVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_110.field_2._M_allocated_capacity = *psVar8;
            local_110.field_2._8_8_ = plVar6[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar8;
            local_110._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_110._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if (local_f0.m_log != &local_e0) {
            operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12],(this->super_TextureTest).m_type);
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)((ulong)((long)local_a8.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_a8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
  }
  else if (0 < iVar9) {
    lVar12 = 0;
    do {
      puVar2 = local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar3) {
        local_4c = puVar2[lVar12];
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_4c);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          local_70 = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_48);
          uVar10 = 0xf;
          if (local_70 != local_60) {
            uVar10 = local_60[0];
          }
          if (uVar10 < local_90._M_string_length + local_68) {
            uVar11 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              uVar11 = local_90.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar11 < local_90._M_string_length + local_68) goto LAB_00937f74;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00937f74:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
          }
          local_f0.m_log = &local_e0;
          pTVar1 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar1) {
            local_e0.m_log = pTVar1->m_log;
            lStack_d8 = plVar6[3];
          }
          else {
            local_e0.m_log = pTVar1->m_log;
            local_f0.m_log = (TestLog *)*plVar6;
          }
          local_e8 = plVar6[1];
          *plVar6 = (long)pTVar1;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar1->m_log = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8.field_2._8_8_ = plVar6[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar8;
            local_c8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_c8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_110.field_2._M_allocated_capacity = *psVar8;
            local_110.field_2._8_8_ = plVar6[3];
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar8;
            local_110._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_110._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(result,&local_110);
          goto LAB_009382bf;
        }
      }
      else {
        local_4c = puVar2[lVar12];
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_4c
                  );
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 == 0) goto LAB_00938353;
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_48);
        uVar10 = 0xf;
        if (local_70 != local_60) {
          uVar10 = local_60[0];
        }
        if (uVar10 < local_90._M_string_length + local_68) {
          uVar11 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            uVar11 = local_90.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar11 < local_90._M_string_length + local_68) goto LAB_00938086;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
        }
        else {
LAB_00938086:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
        }
        local_f0.m_log = &local_e0;
        pTVar1 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar1) {
          local_e0.m_log = pTVar1->m_log;
          lStack_d8 = plVar6[3];
        }
        else {
          local_e0.m_log = pTVar1->m_log;
          local_f0.m_log = (TestLog *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)pTVar1;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar1->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8.field_2._8_8_ = puVar7[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar8;
          local_c8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_c8._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110.field_2._8_8_ = plVar6[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar8;
          local_110._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_110._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(result,&local_110);
LAB_009382bf:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_f0.m_log != &local_e0) {
          operator_delete(local_f0.m_log,(ulong)((long)&(local_e0.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
      }
LAB_00938353:
      StateQueryUtil::verifyStateTextureParamInteger
                (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12],(this->super_TextureTest).m_type);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)((ulong)((long)local_a8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_a8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void TextureFilterCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool			isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const glw::GLenum	initial		= (m_pname == GL_TEXTURE_MAG_FILTER) ? (GL_LINEAR)
									: (m_pname == GL_TEXTURE_MIN_FILTER) ? (GL_NEAREST_MIPMAP_LINEAR)
									: (0);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initial, m_type);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Set", "Set");
		std::vector<GLenum>			values;

		values.push_back(GL_NEAREST);
		values.push_back(GL_LINEAR);
		if (m_pname == GL_TEXTURE_MIN_FILTER)
		{
			values.push_back(GL_NEAREST_MIPMAP_NEAREST);
			values.push_back(GL_NEAREST_MIPMAP_LINEAR);
			values.push_back(GL_LINEAR_MIPMAP_NEAREST);
			values.push_back(GL_LINEAR_MIPMAP_LINEAR);
		}

		if (isPureCase)
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)values[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = values[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < (int)values.size(); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)values[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, values[ndx], m_type);
			}
		}
	}
}